

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O2

Vec_Int_t * Acec_BuildTree(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Int_t *vRootLits)

{
  void *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *vLeafMap;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  
  iVar7 = vLeafLits->nSize;
  vLeafMap = (Vec_Wec_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar7 - 1U) {
    iVar1 = iVar7;
  }
  vLeafMap->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar1,0x10);
  }
  vLeafMap->pArray = pVVar4;
  vLeafMap->nSize = iVar7;
  if (vRootLits != (Vec_Int_t *)0x0) {
    for (iVar7 = 0; iVar7 < vRootLits->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(vRootLits,iVar7);
      if (iVar7 < vLeafMap->nSize) {
        pVVar4 = Vec_WecEntry(vLeafMap,iVar7);
      }
      else {
        pVVar4 = Vec_WecPushLevel(vLeafMap);
      }
      Vec_IntPush(pVVar4,iVar1);
    }
  }
  iVar7 = 0;
  while (iVar1 = iVar7, iVar1 < vLeafLits->nSize) {
    pVVar4 = Vec_WecEntry(vLeafLits,iVar1);
    iVar7 = iVar1 + 1;
    for (i = 0; i < pVVar4->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(pVVar4,i);
      iVar3 = Abc_Lit2Var(iVar2);
      pObj = Gia_ManObj(p,iVar3);
      iVar3 = Acec_InsertBox_rec(pNew,p,pObj);
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_LitNotCond(iVar3,iVar2);
      if (vLeafMap->nSize <= iVar1) {
        iVar3 = vLeafMap->nSize * 2;
        if (iVar3 <= iVar7) {
          iVar3 = iVar7;
        }
        Vec_WecGrow(vLeafMap,iVar3);
        vLeafMap->nSize = iVar7;
      }
      pVVar5 = Vec_WecEntry(vLeafMap,iVar1);
      Vec_IntPush(pVVar5,iVar2);
    }
  }
  pVVar5 = Acec_InsertTree(pNew,vLeafMap);
  pVVar4 = vLeafMap->pArray;
  uVar8 = 0;
  uVar6 = (ulong)(uint)vLeafMap->nCap;
  if (vLeafMap->nCap < 1) {
    uVar6 = uVar8;
  }
  for (; uVar6 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
    __ptr = *(void **)((long)&pVVar4->pArray + uVar8);
    if (__ptr != (void *)0x0) {
      free(__ptr);
      *(undefined8 *)((long)&pVVar4->pArray + uVar8) = 0;
    }
  }
  free(pVVar4);
  free(vLeafMap);
  return pVVar5;
}

Assistant:

Vec_Int_t * Acec_BuildTree( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Int_t * vRootLits )
{
    Vec_Wec_t * vLeafMap = Vec_WecStart( Vec_WecSize(vLeafLits) );
    Vec_Int_t * vLevel, * vRootRanks;  
    int i, k, iLit, iLitNew;
    // add roo literals
    if ( vRootLits )
        Vec_IntForEachEntry( vRootLits, iLit, i )
        {
            if ( i < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, iLit );
        }
    // add other literals
    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = Acec_InsertBox_rec( pNew, p, pObj );
            iLitNew = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
            Vec_WecPush( vLeafMap, i, iLitNew );
        }
    // construct map of root literals
    vRootRanks = Acec_InsertTree( pNew, vLeafMap );
    Vec_WecFree( vLeafMap );
    return vRootRanks;
}